

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs_queue.c
# Opt level: O2

int pop_job(jobs_queue_t *q,job_t **j)

{
  ulong uVar1;
  job_t **__ptr;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  
  pthread_mutex_lock((pthread_mutex_t *)q);
  uVar1 = q->high_bound;
  uVar3 = q->low_bound;
  if (uVar3 == uVar1) {
    q->high_bound = 0;
    q->low_bound = 0;
    *j = (job_t *)0x0;
    q->size = 0;
    iVar4 = 3;
  }
  else if (uVar3 < 0x19000) {
    q->low_bound = uVar3 + 1;
    *j = q->array[uVar3];
    q->size = uVar1 - (uVar3 + 1);
    iVar4 = 0;
  }
  else if (uVar3 == 0x19000) {
    uVar3 = uVar1 - 0x19000;
    for (sVar2 = 0x19001; (0x19000 - uVar1) + sVar2 != 0x19001; sVar2 = sVar2 + 1) {
      q->low_bound = sVar2;
      q->array[sVar2 - 0x19001] = q->array[sVar2 - 1];
    }
    q->low_bound = 0;
    iVar4 = 0;
    __ptr = q->array;
    if (uVar3 < 0x19000) {
      __ptr = (job_t **)realloc(__ptr,0xc8000);
      if (__ptr == (job_t **)0x0) {
        WriteLogPError("pop_job()");
        iVar4 = 2;
        goto LAB_00103a5b;
      }
      q->array = __ptr;
      q->capacity = 0x19000;
      sVar2 = q->low_bound;
    }
    else {
      sVar2 = 0;
    }
    q->high_bound = uVar3;
    q->low_bound = sVar2 + 1;
    *j = __ptr[sVar2];
    q->size = uVar3 - (sVar2 + 1);
  }
  else {
    iVar4 = 1;
  }
LAB_00103a5b:
  pthread_mutex_unlock((pthread_mutex_t *)q);
  return iVar4;
}

Assistant:

int pop_job(jobs_queue_t* q, job_t **j)
{
  pthread_mutex_lock(&q->lock);
  size_t size, i;
  job_t** ptr;

  if(q->low_bound == q->high_bound)
    {
      q->low_bound = q->high_bound = 0;
      *j = NULL;
#ifdef QUEUEDEBUG
      WriteLog("Queue '%s' is empty", q->queuename);
#endif
      q->size=q->high_bound-q->low_bound;
      pthread_mutex_unlock(&q->lock);

      return 3;//queue is empty
    }
  else if(q->low_bound < QUEUE_SIZE_RESERVE)
    {
      *j = q->array[(q->low_bound)++];
#ifdef QUEUEDEBUG
      WriteLog("Popped from queue '%s'", q->queuename);
#endif
      q->size=q->high_bound-q->low_bound;
      pthread_mutex_unlock(&q->lock);
      return 0;
    }
  else if(q->low_bound == QUEUE_SIZE_RESERVE)
    {
      size = (q->high_bound) - (q->low_bound);//size of the queue
      //moving all data to zero level and reset the low_bound to null
      for(i=0; i < size; i++)
        q->array[i]=q->array[(q->low_bound)++];
      q->low_bound = 0;//reset low_bound
      if(size < QUEUE_SIZE_RESERVE)
        {
          ptr=((job_t**)realloc(q->array,QUEUE_SIZE_RESERVE*sizeof(job_t*)));
          if(ptr == NULL)
            {
              WriteLogPError("pop_job()");
              pthread_mutex_unlock(&q->lock);
              return 2;
            }
          q->array = ptr;
          q->capacity=QUEUE_SIZE_RESERVE;
        }
      q->high_bound=size;//set high_bound to size
      *j = q->array[(q->low_bound)++];
#ifdef QUEUEDEBUG
      WriteLog("Popped from queue '%s'", q->queuename);
#endif
      q->size=q->high_bound-q->low_bound;
      pthread_mutex_unlock(&q->lock);
      return 0;
    }

  pthread_mutex_unlock(&q->lock);
  return 1;

}